

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::Encode(SilentEntitySystem *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pEVar3;
  __normal_iterator<const_KDIS::DATA_TYPE::EntityAppearance_*,_std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  SilentEntitySystem *this_local;
  
  pKVar2 = KDataStream::operator<<(stream,this->m_ui16NumEnts);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16NumOfAppearanceRecords);
  DATA_TYPE::operator<<(pKVar2,&(this->m_EntTyp).super_DataTypeBase);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
            ::begin(&this->m_vEA);
  local_28._M_current =
       (EntityAppearance *)
       std::
       vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
       ::end(&this->m_vEA);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::EntityAppearance_*,_std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>_>
             ::operator->(&citrEnd);
    (*(pEVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EntityAppearance_*,_std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void SilentEntitySystem::Encode( KDataStream & stream ) const
{
    stream << m_ui16NumEnts
           << m_ui16NumOfAppearanceRecords
           << KDIS_STREAM m_EntTyp;

    vector<EntityAppearance>::const_iterator citr = m_vEA.begin();
    vector<EntityAppearance>::const_iterator citrEnd = m_vEA.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}